

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_search.c
# Opt level: O0

REF_STATUS ref_search_tec(REF_SEARCH ref_search,char *filename)

{
  FILE *__stream;
  int local_38;
  int local_34;
  REF_INT j;
  REF_INT i;
  char *zonetype;
  FILE *f;
  char *filename_local;
  REF_SEARCH ref_search_local;
  
  __stream = fopen(filename,"w");
  if (__stream == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",0x2b5,
           "ref_search_tec","unable to open file");
    ref_search_local._4_4_ = 2;
  }
  else if (ref_search->d == 3) {
    fprintf(__stream,"title=\"tecplot refine search\"\n");
    fprintf(__stream,"variables = \"x\" \"y\" \"z\" \"r\" \"i\"\n");
    fprintf(__stream,"zone t=\"tree\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
            (ulong)(uint)ref_search->n,(ulong)(uint)(ref_search->n << 1),"point","felineseg");
    for (local_34 = 0; local_34 < ref_search->n; local_34 = local_34 + 1) {
      fprintf(__stream," %f %f %f %f %d\n",ref_search->pos[ref_search->d * local_34],
              ref_search->pos[ref_search->d * local_34 + 1],
              ref_search->pos[ref_search->d * local_34 + 2],ref_search->radius[local_34],
              (ulong)(uint)ref_search->item[local_34]);
    }
    for (local_34 = 0; local_34 < ref_search->n; local_34 = local_34 + 1) {
      local_38 = ref_search->right[local_34];
      if (local_38 == -1) {
        local_38 = local_34;
      }
      fprintf(__stream," %d %d\n",(ulong)(local_34 + 1),(ulong)(local_38 + 1));
      local_38 = ref_search->left[local_34];
      if (local_38 == -1) {
        local_38 = local_34;
      }
      fprintf(__stream," %d %d\n",(ulong)(local_34 + 1),(ulong)(local_38 + 1));
    }
    fclose(__stream);
    ref_search_local._4_4_ = 0;
  }
  else {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",0x2b7,
           "ref_search_tec","limited to 3D");
    ref_search_local._4_4_ = 1;
  }
  return ref_search_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_search_tec(REF_SEARCH ref_search, const char *filename) {
  FILE *f;
  const char *zonetype = "felineseg";
  REF_INT i;
  f = fopen(filename, "w");
  if (NULL == (void *)f) printf("unable to open %s\n", filename);
  RNS(f, "unable to open file");

  RAS(3 == ref_search->d, "limited to 3D");

  fprintf(f, "title=\"tecplot refine search\"\n");
  fprintf(f, "variables = \"x\" \"y\" \"z\" \"r\" \"i\"\n");

  fprintf(f,
          "zone t=\"tree\", nodes=%d, elements=%d, datapacking=%s, "
          "zonetype=%s\n",
          ref_search->n, 2 * (ref_search->n), "point", zonetype);

  for (i = 0; i < ref_search->n; i++) {
    fprintf(f, " %f %f %f %f %d\n", ref_search->pos[0 + ref_search->d * i],
            ref_search->pos[1 + ref_search->d * i],
            ref_search->pos[2 + ref_search->d * i], ref_search->radius[i],
            ref_search->item[i]);
  }

  for (i = 0; i < ref_search->n; i++) {
    REF_INT j;
    j = ref_search->right[i];
    if (REF_EMPTY == j) j = i;
    fprintf(f, " %d %d\n", i + 1, j + 1);
    j = ref_search->left[i];
    if (REF_EMPTY == j) j = i;
    fprintf(f, " %d %d\n", i + 1, j + 1);
  }

  fclose(f);
  return REF_SUCCESS;
}